

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

char * blogc_get_filename(char *f)

{
  bool bVar1;
  size_t sVar2;
  char *__s;
  char *final_filename;
  int i;
  _Bool removed_dot;
  char *tmp;
  char *filename;
  char *f_local;
  
  if (f == (char *)0x0) {
    f_local = (char *)0x0;
  }
  else {
    sVar2 = strlen(f);
    if (sVar2 == 0) {
      f_local = (char *)0x0;
    }
    else {
      __s = bc_strdup(f);
      bVar1 = false;
      sVar2 = strlen(__s);
      for (final_filename._0_4_ = (int)sVar2; _i = __s, -1 < (int)final_filename;
          final_filename._0_4_ = (int)final_filename + -1) {
        if ((bVar1) || (__s[(int)final_filename] != '.')) {
          if ((__s[(int)final_filename] == '/') || (__s[(int)final_filename] == '\\')) {
            _i = __s + ((int)final_filename + 1);
            break;
          }
        }
        else {
          __s[(int)final_filename] = '\0';
          bVar1 = true;
        }
      }
      f_local = bc_strdup(_i);
      free(__s);
    }
  }
  return f_local;
}

Assistant:

char*
blogc_get_filename(const char *f)
{
    if (f == NULL)
        return NULL;

    if (strlen(f) == 0)
        return NULL;

    char *filename = bc_strdup(f);

    // keep a pointer to original string
    char *tmp = filename;

    bool removed_dot = false;
    for (int i = strlen(tmp); i >= 0 ; i--) {

        // remove last extension
        if (!removed_dot && tmp[i] == '.') {
            tmp[i] = '\0';
            removed_dot = true;
            continue;
        }

        if (tmp[i] == '/' || tmp[i] == '\\') {
            tmp += i + 1;
            break;
        }
    }

    char *final_filename = bc_strdup(tmp);
    free(filename);

    return final_filename;
}